

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O3

void __thiscall icu_63::double_conversion::Bignum::BigitsShiftLeft(Bignum *this,int shift_amount)

{
  uint uVar1;
  uint *puVar2;
  byte bVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  
  if (0 < this->used_digits_) {
    puVar2 = (this->bigits_).start_;
    lVar4 = 0;
    uVar5 = 0;
    do {
      uVar1 = puVar2[lVar4];
      bVar3 = 0x1c - (byte)shift_amount & 0x1f;
      uVar6 = uVar1 >> bVar3;
      puVar2[lVar4] = (uVar1 << ((byte)shift_amount & 0x1f)) + uVar5 & 0xfffffff;
      lVar4 = lVar4 + 1;
      uVar5 = uVar6;
    } while (lVar4 < this->used_digits_);
    if (uVar1 >> bVar3 != 0) {
      (this->bigits_).start_[this->used_digits_] = uVar6;
      this->used_digits_ = this->used_digits_ + 1;
    }
  }
  return;
}

Assistant:

void Bignum::BigitsShiftLeft(int shift_amount) {
  ASSERT(shift_amount < kBigitSize);
  ASSERT(shift_amount >= 0);
  Chunk carry = 0;
  for (int i = 0; i < used_digits_; ++i) {
    Chunk new_carry = bigits_[i] >> (kBigitSize - shift_amount);
    bigits_[i] = ((bigits_[i] << shift_amount) + carry) & kBigitMask;
    carry = new_carry;
  }
  if (carry != 0) {
    bigits_[used_digits_] = carry;
    used_digits_++;
  }
}